

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

IssuePtr __thiscall libcellml::Logger::error(Logger *this,size_t index)

{
  LoggerImpl *pLVar1;
  size_type sVar2;
  LoggerImpl *this_00;
  const_reference pvVar3;
  const_reference pvVar4;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  IssuePtr IVar6;
  size_t index_local;
  Logger *this_local;
  IssuePtr *issue;
  
  std::shared_ptr<libcellml::Issue>::shared_ptr((shared_ptr<libcellml::Issue> *)this,(nullptr_t)0x0)
  ;
  pLVar1 = pFunc((Logger *)index);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pLVar1->mErrors);
  _Var5._M_pi = extraout_RDX;
  if (in_RDX < sVar2) {
    pLVar1 = pFunc((Logger *)index);
    this_00 = pFunc((Logger *)index);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&this_00->mErrors,in_RDX);
    pvVar4 = std::
             vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
             ::at(&pLVar1->mIssues,*pvVar3);
    std::shared_ptr<libcellml::Issue>::operator=((shared_ptr<libcellml::Issue> *)this,pvVar4);
    _Var5._M_pi = extraout_RDX_00;
  }
  IVar6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  IVar6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IssuePtr)IVar6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IssuePtr Logger::error(size_t index) const
{
    IssuePtr issue = nullptr;
    if (index < pFunc()->mErrors.size()) {
        issue = pFunc()->mIssues.at(pFunc()->mErrors.at(index));
    }
    return issue;
}